

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# walletdb.cpp
# Opt level: O0

LoadResult
wallet::LoadRecords(CWallet *pwallet,DatabaseBatch *batch,string *key,LoadFunc *load_func)

{
  long lVar1;
  LoadResult LVar2;
  function<wallet::DBErrors_(wallet::CWallet_*,_DataStream_&,_DataStream_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  *in_RDI;
  long in_FS_OFFSET;
  DataStream prefix;
  function<wallet::DBErrors_(wallet::CWallet_*,_DataStream_&,_DataStream_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  *in_stack_ffffffffffffff38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff40;
  DataStream *in_stack_ffffffffffffff48;
  function<wallet::DBErrors_(wallet::CWallet_*,_DataStream_&,_DataStream_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  *in_stack_ffffffffffffff50;
  LoadFunc *in_stack_ffffffffffffffb0;
  DataStream *in_stack_ffffffffffffffb8;
  string *in_stack_ffffffffffffffc0;
  DatabaseBatch *in_stack_ffffffffffffffc8;
  CWallet *in_stack_ffffffffffffffd0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  DataStream::DataStream((DataStream *)in_stack_ffffffffffffff38);
  DataStream::operator<<(in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
  std::
  function<wallet::DBErrors_(wallet::CWallet_*,_DataStream_&,_DataStream_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::function(in_RDI,in_stack_ffffffffffffff50);
  LVar2 = LoadRecords(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,
                      in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  std::
  function<wallet::DBErrors_(wallet::CWallet_*,_DataStream_&,_DataStream_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(in_stack_ffffffffffffff38);
  DataStream::~DataStream((DataStream *)in_stack_ffffffffffffff38);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return LVar2;
  }
  __stack_chk_fail();
}

Assistant:

static LoadResult LoadRecords(CWallet* pwallet, DatabaseBatch& batch, const std::string& key, LoadFunc load_func)
{
    DataStream prefix;
    prefix << key;
    return LoadRecords(pwallet, batch, key, prefix, load_func);
}